

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O2

void duckdb::ParquetMetaDataImplementation<(duckdb::ParquetMetadataOperatorType)0>
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  bool bVar1;
  ParquetMetaDataOperatorData *this;
  FunctionData *pFVar2;
  MultiFileList *this_00;
  
  this = (ParquetMetaDataOperatorData *)
         optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  pFVar2 = optional_ptr<const_duckdb::FunctionData,_true>::operator->(&data_p->bind_data);
  do {
    while (bVar1 = ColumnDataCollection::Scan(&this->collection,&this->scan_state,output), !bVar1) {
      this_00 = shared_ptr<duckdb::MultiFileList,_true>::operator->
                          ((shared_ptr<duckdb::MultiFileList,_true> *)(pFVar2 + 7));
      bVar1 = MultiFileList::Scan(this_00,&this->file_list_scan,&this->current_file);
      if (!bVar1) {
        return;
      }
      ParquetMetaDataOperatorData::LoadRowGroupMetadata
                (this,context,(vector<duckdb::LogicalType,_true> *)(pFVar2 + 4),&this->current_file)
      ;
    }
  } while (output->count == 0);
  return;
}

Assistant:

void ParquetMetaDataImplementation(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<ParquetMetaDataOperatorData>();
	auto &bind_data = data_p.bind_data->Cast<ParquetMetaDataBindData>();

	while (true) {
		if (!data.collection.Scan(data.scan_state, output)) {

			// Try get next file
			if (!bind_data.file_list->Scan(data.file_list_scan, data.current_file)) {
				return;
			}

			switch (TYPE) {
			case ParquetMetadataOperatorType::SCHEMA:
				data.LoadSchemaData(context, bind_data.return_types, data.current_file);
				break;
			case ParquetMetadataOperatorType::META_DATA:
				data.LoadRowGroupMetadata(context, bind_data.return_types, data.current_file);
				break;
			case ParquetMetadataOperatorType::KEY_VALUE_META_DATA:
				data.LoadKeyValueMetaData(context, bind_data.return_types, data.current_file);
				break;
			case ParquetMetadataOperatorType::FILE_META_DATA:
				data.LoadFileMetaData(context, bind_data.return_types, data.current_file);
				break;
			case ParquetMetadataOperatorType::BLOOM_PROBE: {
				auto &bloom_probe_bind_data = data_p.bind_data->Cast<ParquetBloomProbeBindData>();
				data.ExecuteBloomProbe(context, bind_data.return_types, data.current_file,
				                       bloom_probe_bind_data.probe_column_name, bloom_probe_bind_data.probe_constant);
				break;
			}
			default:
				throw InternalException("Unsupported ParquetMetadataOperatorType");
			}
			continue;
		}
		if (output.size() != 0) {
			return;
		}
	}
}